

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSNet.h
# Opt level: O1

int GetAddrPortTypeFromDevPath
              (char *szDevPath,char *address,size_t addresslen,char *port,size_t portlen,
              int *pDevType)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  size_t sVar5;
  char *pcVar6;
  size_t sVar7;
  
  if (portlen < 6) {
    return 1;
  }
  if (addresslen < 0x10) {
    return 1;
  }
  if (szDevPath == (char *)0x0) {
    return 1;
  }
  if (address == (char *)0x0) {
    return 1;
  }
  if (port == (char *)0x0) {
    return 1;
  }
  if (pDevType == (int *)0x0) {
    return 1;
  }
  pcVar6 = (char *)0x0;
  *address = '\0';
  *port = '\0';
  *pDevType = 0;
  pcVar4 = strchr(szDevPath,0x3a);
  if (pcVar4 != (char *)0x0) {
    sVar5 = strlen(pcVar4);
    if (sVar5 < 6) {
      pcVar6 = (char *)0x0;
    }
    else {
      pcVar6 = strchr(pcVar4 + 1,0x3a);
    }
  }
  sVar5 = strlen(szDevPath);
  if ((((sVar5 < 0x15) || (iVar2 = strncmp(szDevPath,"tcp-connect:",0xc), pcVar6 == (char *)0x0)) ||
      (iVar2 != 0)) || (pcVar6[1] == '\0')) {
    if (sVar5 < 0x14) {
LAB_001057c1:
      if (0x11 < sVar5) {
        iVar2 = strncmp(szDevPath,"tcpsrv://",9);
        if (iVar2 == 0) {
          if (pcVar6 != (char *)0x0) goto LAB_00105807;
        }
        else {
          iVar2 = strncmp(szDevPath,"tcpsvr://",9);
          if ((pcVar6 != (char *)0x0) && (iVar2 == 0)) {
LAB_00105807:
            if (pcVar6[1] != '\0') {
              pcVar4 = szDevPath + 9;
              goto LAB_001058b7;
            }
          }
        }
        if (0x11 < sVar5) {
          iVar2 = strncmp(szDevPath,"udpsrv://",9);
          if (iVar2 == 0) {
            if (pcVar6 != (char *)0x0) goto LAB_00105858;
          }
          else {
            iVar2 = strncmp(szDevPath,"udpsvr://",9);
            if ((pcVar6 != (char *)0x0) && (iVar2 == 0)) {
LAB_00105858:
              if (pcVar6[1] != '\0') {
                pcVar4 = szDevPath + 9;
                goto LAB_0010595d;
              }
            }
          }
        }
      }
      if (0xf < sVar5) {
        iVar2 = strncmp(szDevPath,"tcpsrv:",7);
        if (iVar2 == 0) {
          if (pcVar6 != (char *)0x0) goto LAB_001058ad;
        }
        else {
          iVar2 = strncmp(szDevPath,"tcpsvr:",7);
          if ((pcVar6 != (char *)0x0) && (iVar2 == 0)) {
LAB_001058ad:
            if (pcVar6[1] != '\0') {
              pcVar4 = szDevPath + 7;
              goto LAB_001058b7;
            }
          }
        }
        if (0xf < sVar5) {
          iVar2 = strncmp(szDevPath,"udpsrv:",7);
          if (iVar2 == 0) {
            if (pcVar6 != (char *)0x0) goto LAB_00105953;
          }
          else {
            iVar2 = strncmp(szDevPath,"udpsvr:",7);
            if ((pcVar6 != (char *)0x0) && (iVar2 == 0)) {
LAB_00105953:
              if (pcVar6[1] != '\0') {
                pcVar4 = szDevPath + 7;
                goto LAB_0010595d;
              }
            }
          }
        }
      }
      if (0xe < sVar5) {
        iVar2 = strncmp(szDevPath,"tcp://",6);
        if (((pcVar6 != (char *)0x0) && (iVar2 == 0)) && (pcVar6[1] != '\0')) {
          pcVar4 = szDevPath + 6;
          goto LAB_00105a4f;
        }
        if (((sVar5 < 0xf) || (iVar2 = strncmp(szDevPath,"udp://",6), pcVar6 == (char *)0x0)) ||
           ((iVar2 != 0 || (pcVar6[1] == '\0')))) goto LAB_00105a1e;
        pcVar4 = szDevPath + 6;
LAB_00105af0:
        sVar5 = (long)pcVar6 - (long)pcVar4;
        if (addresslen < sVar5 + 1) {
          return 1;
        }
        sVar7 = strlen(pcVar6 + 1);
        if (portlen < sVar7 + 1) {
          return 1;
        }
        memcpy(address,pcVar4,sVar5);
        address[sVar5 + 1] = '\0';
        strcpy(port,pcVar6 + 1);
        iVar2 = 3;
        goto LAB_00105cd0;
      }
LAB_00105a1e:
      if (0xc < sVar5) {
        iVar2 = strncmp(szDevPath,"tcp:",4);
        if (((pcVar6 != (char *)0x0) && (iVar2 == 0)) && (pcVar6[1] != '\0')) {
          pcVar4 = szDevPath + 4;
          goto LAB_00105a4f;
        }
        if ((((0xc < sVar5) && (iVar2 = strncmp(szDevPath,"udp:",4), pcVar6 != (char *)0x0)) &&
            (iVar2 == 0)) && (pcVar6[1] != '\0')) {
          pcVar4 = szDevPath + 4;
          goto LAB_00105af0;
        }
      }
      if (sVar5 < 8) {
LAB_00105c32:
        if (4 < sVar5) {
          iVar2 = strncmp(szDevPath,"tcp:",4);
          if (iVar2 == 0) {
            pcVar6 = szDevPath + 4;
            iVar2 = atoi(pcVar6);
            if (0 < iVar2) {
              sVar5 = strlen(pcVar6);
              goto joined_r0x00105bb0;
            }
          }
          if ((4 < sVar5) && (iVar2 = strncmp(szDevPath,"udp:",4), iVar2 == 0)) {
            pcVar6 = szDevPath + 4;
            iVar2 = atoi(pcVar6);
            if (0 < iVar2) {
              sVar5 = strlen(pcVar6);
              goto joined_r0x00105c1f;
            }
          }
        }
        if (pcVar4 == (char *)0x0) {
          return 0;
        }
        bVar1 = *szDevPath;
        if (bVar1 == 0x3a) {
          pcVar6 = szDevPath + 1;
          iVar2 = atoi(pcVar6);
          if (0 < iVar2) {
            sVar5 = strlen(pcVar6);
            goto joined_r0x00105bb0;
          }
        }
        pcVar6 = pcVar4 + 1;
        iVar2 = atoi(pcVar6);
        if (9 < bVar1 - 0x30 || iVar2 < 1) {
          return 0;
        }
        sVar5 = (long)pcVar4 - (long)szDevPath;
        if (addresslen < sVar5 + 1) {
          return 1;
        }
        sVar7 = strlen(pcVar6);
        if (portlen < sVar7 + 1) {
          return 1;
        }
        memcpy(address,szDevPath,sVar5);
        address[sVar5 + 1] = '\0';
        uVar3 = atoi(pcVar6);
        sprintf(port,"%d",(ulong)uVar3);
        goto LAB_00105ab5;
      }
      iVar2 = strncmp(szDevPath,"tcpsrv:",7);
      if (((iVar2 != 0) && (iVar2 = strncmp(szDevPath,"tcpsvr:",7), iVar2 != 0)) ||
         (iVar2 = atoi(szDevPath + 4), iVar2 < 1)) {
        if (((sVar5 < 8) ||
            ((iVar2 = strncmp(szDevPath,"udpsrv:",7), iVar2 != 0 &&
             (iVar2 = strncmp(szDevPath,"udpsvr:",7), iVar2 != 0)))) ||
           (iVar2 = atoi(szDevPath + 4), iVar2 < 1)) goto LAB_00105c32;
        pcVar6 = szDevPath + 7;
        sVar5 = strlen(pcVar6);
joined_r0x00105c1f:
        if (portlen < sVar5 + 1) {
          return 1;
        }
        goto LAB_001059ae;
      }
      pcVar6 = szDevPath + 7;
      sVar5 = strlen(pcVar6);
joined_r0x00105bb0:
      if (portlen < sVar5 + 1) {
        return 1;
      }
    }
    else {
      iVar2 = strncmp(szDevPath,"tcp-listen:",0xb);
      if (((pcVar6 == (char *)0x0) || (iVar2 != 0)) || (pcVar6[1] == '\0')) {
        if (((sVar5 < 0x14) || (iVar2 = strncmp(szDevPath,"udp-listen:",0xb), pcVar6 == (char *)0x0)
            ) || ((iVar2 != 0 || (pcVar6[1] == '\0')))) goto LAB_001057c1;
        pcVar4 = szDevPath + 0xb;
LAB_0010595d:
        sVar5 = (long)pcVar6 - (long)pcVar4;
        if (addresslen < sVar5 + 1) {
          return 1;
        }
        pcVar6 = pcVar6 + 1;
        sVar7 = strlen(pcVar6);
        if (portlen < sVar7 + 1) {
          return 1;
        }
        memcpy(address,pcVar4,sVar5);
        address[sVar5 + 1] = '\0';
LAB_001059ae:
        strcpy(port,pcVar6);
        iVar2 = 4;
        goto LAB_00105cd0;
      }
      pcVar4 = szDevPath + 0xb;
LAB_001058b7:
      sVar5 = (long)pcVar6 - (long)pcVar4;
      if (addresslen < sVar5 + 1) {
        return 1;
      }
      pcVar6 = pcVar6 + 1;
      sVar7 = strlen(pcVar6);
      if (portlen < sVar7 + 1) {
        return 1;
      }
      memcpy(address,pcVar4,sVar5);
      address[sVar5 + 1] = '\0';
    }
    strcpy(port,pcVar6);
    iVar2 = 2;
  }
  else {
    pcVar4 = szDevPath + 0xc;
LAB_00105a4f:
    sVar5 = (long)pcVar6 - (long)pcVar4;
    if (addresslen < sVar5 + 1) {
      return 1;
    }
    sVar7 = strlen(pcVar6 + 1);
    if (portlen < sVar7 + 1) {
      return 1;
    }
    memcpy(address,pcVar4,sVar5);
    address[sVar5 + 1] = '\0';
    strcpy(port,pcVar6 + 1);
LAB_00105ab5:
    iVar2 = 1;
  }
LAB_00105cd0:
  *pDevType = iVar2;
  return 0;
}

Assistant:

inline int GetAddrPortTypeFromDevPath(char* szDevPath, char* address, size_t addresslen, char* port, size_t portlen, int* pDevType)
{
	char* ptr = NULL;
	char* ptr2 = NULL;
	size_t tmplen = 0;

	if ((szDevPath == NULL)||(address == NULL)||(port == NULL)||(pDevType == NULL)||(addresslen < 16)||(portlen < 6)) return EXIT_FAILURE;

	address[0] = 0;
	port[0] = 0;
	*pDevType = OTHER_DEV_TYPE_OSNET;

	ptr = strchr(szDevPath, ':');
	if ((ptr != NULL)&&(strlen(ptr) >= 6)) ptr2 = strchr(ptr+1, ':');

	if ((strlen(szDevPath) >= 12+7+1+1)&&(strncmp(szDevPath, "tcp-connect:", strlen("tcp-connect:")) == 0)&&(ptr2 != NULL)&&(ptr2[1] != 0))
	{
		tmplen = ptr2-(szDevPath+12);
		if ((addresslen < tmplen+1)||(portlen < strlen(ptr2+1)+1)) return EXIT_FAILURE;
		memcpy(address, szDevPath+12, tmplen);
		address[tmplen+1] = 0;
		strcpy(port, ptr2+1);
		*pDevType = TCP_CLIENT_DEV_TYPE_OSNET;
	}
	else if ((strlen(szDevPath) >= 11+7+1+1)&&(strncmp(szDevPath, "tcp-listen:", strlen("tcp-listen:")) == 0)&&(ptr2 != NULL)&&(ptr2[1] != 0))
	{
		tmplen = ptr2-(szDevPath+11);
		if ((addresslen < tmplen+1)||(portlen < strlen(ptr2+1)+1)) return EXIT_FAILURE;
		memcpy(address, szDevPath+11, tmplen);
		address[tmplen+1] = 0;
		strcpy(port, ptr2+1);
		*pDevType = TCP_SERVER_DEV_TYPE_OSNET;
	}
	else if ((strlen(szDevPath) >= 11+7+1+1)&&(strncmp(szDevPath, "udp-listen:", strlen("udp-listen:")) == 0)&&(ptr2 != NULL)&&(ptr2[1] != 0))
	{
		tmplen = ptr2-(szDevPath+11);
		if ((addresslen < tmplen+1)||(portlen < strlen(ptr2+1)+1)) return EXIT_FAILURE;
		memcpy(address, szDevPath+11, tmplen);
		address[tmplen+1] = 0;
		strcpy(port, ptr2+1);
		*pDevType = UDP_SERVER_DEV_TYPE_OSNET;
	}
	else if ((strlen(szDevPath) >= 9+7+1+1)&&((strncmp(szDevPath, "tcpsrv://", strlen("tcpsrv://")) == 0)||(strncmp(szDevPath, "tcpsvr://", strlen("tcpsvr://")) == 0))&&(ptr2 != NULL)&&(ptr2[1] != 0))
	{
		tmplen = ptr2-(szDevPath+9);
		if ((addresslen < tmplen+1)||(portlen < strlen(ptr2+1)+1)) return EXIT_FAILURE;
		memcpy(address, szDevPath+9, tmplen);
		address[tmplen+1] = 0;
		strcpy(port, ptr2+1);
		*pDevType = TCP_SERVER_DEV_TYPE_OSNET;
	}
	else if ((strlen(szDevPath) >= 9+7+1+1)&&((strncmp(szDevPath, "udpsrv://", strlen("udpsrv://")) == 0)||(strncmp(szDevPath, "udpsvr://", strlen("udpsvr://")) == 0))&&(ptr2 != NULL)&&(ptr2[1] != 0))
	{
		tmplen = ptr2-(szDevPath+9);
		if ((addresslen < tmplen+1)||(portlen < strlen(ptr2+1)+1)) return EXIT_FAILURE;
		memcpy(address, szDevPath+9, tmplen);
		address[tmplen+1] = 0;
		strcpy(port, ptr2+1);
		*pDevType = UDP_SERVER_DEV_TYPE_OSNET;
	}
	else if ((strlen(szDevPath) >= 7+7+1+1)&&((strncmp(szDevPath, "tcpsrv:", strlen("tcpsrv:")) == 0)||(strncmp(szDevPath, "tcpsvr:", strlen("tcpsvr:")) == 0))&&(ptr2 != NULL)&&(ptr2[1] != 0))
	{
		tmplen = ptr2-(szDevPath+7);
		if ((addresslen < tmplen+1)||(portlen < strlen(ptr2+1)+1)) return EXIT_FAILURE;
		memcpy(address, szDevPath+7, tmplen);
		address[tmplen+1] = 0;
		strcpy(port, ptr2+1);
		*pDevType = TCP_SERVER_DEV_TYPE_OSNET;
	}
	else if ((strlen(szDevPath) >= 7+7+1+1)&&((strncmp(szDevPath, "udpsrv:", strlen("udpsrv:")) == 0)||(strncmp(szDevPath, "udpsvr:", strlen("udpsvr:")) == 0))&&(ptr2 != NULL)&&(ptr2[1] != 0))
	{
		tmplen = ptr2-(szDevPath+7);
		if ((addresslen < tmplen+1)||(portlen < strlen(ptr2+1)+1)) return EXIT_FAILURE;
		memcpy(address, szDevPath+7, tmplen);
		address[tmplen+1] = 0;
		strcpy(port, ptr2+1);
		*pDevType = UDP_SERVER_DEV_TYPE_OSNET;
	}
	else if ((strlen(szDevPath) >= 6+7+1+1)&&(strncmp(szDevPath, "tcp://", strlen("tcp://")) == 0)&&(ptr2 != NULL)&&(ptr2[1] != 0))
	{
		tmplen = ptr2-(szDevPath+6);
		if ((addresslen < tmplen+1)||(portlen < strlen(ptr2+1)+1)) return EXIT_FAILURE;
		memcpy(address, szDevPath+6, tmplen);
		address[tmplen+1] = 0;
		strcpy(port, ptr2+1);
		*pDevType = TCP_CLIENT_DEV_TYPE_OSNET;
	}
	else if ((strlen(szDevPath) >= 6+7+1+1)&&(strncmp(szDevPath, "udp://", strlen("udp://")) == 0)&&(ptr2 != NULL)&&(ptr2[1] != 0))
	{
		tmplen = ptr2-(szDevPath+6);
		if ((addresslen < tmplen+1)||(portlen < strlen(ptr2+1)+1)) return EXIT_FAILURE;
		memcpy(address, szDevPath+6, tmplen);
		address[tmplen+1] = 0;
		strcpy(port, ptr2+1);
		*pDevType = UDP_CLIENT_DEV_TYPE_OSNET;
	}
	else if ((strlen(szDevPath) >= 4+7+1+1)&&(strncmp(szDevPath, "tcp:", strlen("tcp:")) == 0)&&(ptr2 != NULL)&&(ptr2[1] != 0))
	{
		tmplen = ptr2-(szDevPath+4);
		if ((addresslen < tmplen+1)||(portlen < strlen(ptr2+1)+1)) return EXIT_FAILURE;
		memcpy(address, szDevPath+4, tmplen);
		address[tmplen+1] = 0;
		strcpy(port, ptr2+1);
		*pDevType = TCP_CLIENT_DEV_TYPE_OSNET;
	}
	else if ((strlen(szDevPath) >= 4+7+1+1)&&(strncmp(szDevPath, "udp:", strlen("udp:")) == 0)&&(ptr2 != NULL)&&(ptr2[1] != 0))
	{
		tmplen = ptr2-(szDevPath+4);
		if ((addresslen < tmplen+1)||(portlen < strlen(ptr2+1)+1)) return EXIT_FAILURE;
		memcpy(address, szDevPath+4, tmplen);
		address[tmplen+1] = 0;
		strcpy(port, ptr2+1);
		*pDevType = UDP_CLIENT_DEV_TYPE_OSNET;
	}
	else if ((strlen(szDevPath) >= 7+1)&&((strncmp(szDevPath, "tcpsrv:", strlen("tcpsrv:")) == 0)||(strncmp(szDevPath, "tcpsvr:", strlen("tcpsvr:")) == 0))&&(atoi(szDevPath+4) > 0))
	{
		if (portlen < strlen(szDevPath+7)+1) return EXIT_FAILURE;
		strcpy(port, szDevPath+7);
		*pDevType = TCP_SERVER_DEV_TYPE_OSNET;
	}
	else if ((strlen(szDevPath) >= 7+1)&&((strncmp(szDevPath, "udpsrv:", strlen("udpsrv:")) == 0)||(strncmp(szDevPath, "udpsvr:", strlen("udpsvr:")) == 0))&&(atoi(szDevPath+4) > 0))
	{
		if (portlen < strlen(szDevPath+7)+1) return EXIT_FAILURE;
		strcpy(port, szDevPath+7);
		*pDevType = UDP_SERVER_DEV_TYPE_OSNET;
	}
	else if ((strlen(szDevPath) >= 4+1)&&(strncmp(szDevPath, "tcp:", strlen("tcp:")) == 0)&&(atoi(szDevPath+4) > 0))
	{
		if (portlen < strlen(szDevPath+4)+1) return EXIT_FAILURE;
		strcpy(port, szDevPath+4);
		*pDevType = TCP_SERVER_DEV_TYPE_OSNET;
	}
	else if ((strlen(szDevPath) >= 4+1)&&(strncmp(szDevPath, "udp:", strlen("udp:")) == 0)&&(atoi(szDevPath+4) > 0))
	{
		if (portlen < strlen(szDevPath+4)+1) return EXIT_FAILURE;
		strcpy(port, szDevPath+4);
		*pDevType = UDP_SERVER_DEV_TYPE_OSNET;
	}
	else if ((ptr != NULL)&&(szDevPath[0] == ':')&&(atoi(szDevPath+1) > 0))
	{
		if (portlen < strlen(szDevPath+1)+1) return EXIT_FAILURE;
		strcpy(port, szDevPath+1);
		*pDevType = TCP_SERVER_DEV_TYPE_OSNET;
	}
	else if ((ptr != NULL)&&(atoi(ptr+1) > 0)&&(isdigit((unsigned char)szDevPath[0])))
	{
		tmplen = ptr-szDevPath;
		if ((addresslen < tmplen+1)||(portlen < strlen(ptr+1)+1)) return EXIT_FAILURE;
		memcpy(address, szDevPath, tmplen);
		address[tmplen+1] = 0;
		//strcpy(port, ptr+1);
		sprintf(port, "%d", atoi(ptr+1)); // Other non-digit characters may follow the port...
		*pDevType = TCP_CLIENT_DEV_TYPE_OSNET;
	}

	return EXIT_SUCCESS;
}